

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH54
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command_conflict *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ushort uVar8;
  ushort uVar9;
  uint32_t uVar10;
  ulong uVar11;
  uint8_t *puVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  uint32_t uVar21;
  size_t sVar22;
  ulong uVar23;
  uint8_t uVar24;
  uint *puVar25;
  Command_conflict *pCVar26;
  uint uVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  size_t local_f8;
  ulong local_e8;
  ulong local_e0;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  uint local_68;
  
  local_f8 = *last_insert_len;
  uVar2 = position + num_bytes;
  uVar11 = (position - 7) + num_bytes;
  if (num_bytes < 8) {
    uVar11 = position;
  }
  lVar28 = 0x200;
  if (params->quality < 9) {
    lVar28 = 0x40;
  }
  pCVar26 = commands;
  if (uVar2 <= position + 8) {
LAB_0011777e:
    *last_insert_len = (local_f8 + uVar2) - position;
    *num_commands = *num_commands + ((long)pCVar26 - (long)commands >> 4);
    return;
  }
  uVar33 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar35 = lVar28 + position;
  uVar1 = uVar2 - 7;
  lVar4 = position - 1;
  sVar22 = position;
LAB_00116c9d:
  local_e8 = uVar2 - sVar22;
  uVar18 = uVar33;
  if (sVar22 < uVar33) {
    uVar18 = sVar22;
  }
  uVar34 = sVar22 & ringbuffer_mask;
  puVar3 = ringbuffer + uVar34;
  uVar24 = ringbuffer[uVar34];
  local_e0 = (ulong)*dist_cache;
  local_c0 = 0x7e4;
  local_68 = (uint)ringbuffer_mask;
  if ((sVar22 - local_e0 < sVar22) &&
     (uVar13 = (ulong)((uint)(sVar22 - local_e0) & local_68), uVar24 == ringbuffer[uVar13])) {
    if (7 < local_e8) {
      uVar15 = local_e8 & 0xfffffffffffffff8;
      puVar12 = ringbuffer + uVar15 + uVar34;
      lVar16 = 0;
      uVar20 = 0;
LAB_00116d29:
      if (*(ulong *)(puVar3 + uVar20 * 8) == *(ulong *)(ringbuffer + uVar20 * 8 + uVar13))
      goto code_r0x00116d3a;
      uVar20 = *(ulong *)(ringbuffer + uVar20 * 8 + uVar13) ^ *(ulong *)(puVar3 + uVar20 * 8);
      uVar13 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
        }
      }
      uVar20 = (uVar13 >> 3 & 0x1fffffff) - lVar16;
      goto LAB_00117361;
    }
    uVar15 = 0;
    puVar12 = puVar3;
LAB_00117746:
    uVar17 = local_e8 & 7;
    uVar20 = uVar15;
    if (uVar17 != 0) {
      uVar23 = uVar15 | uVar17;
      do {
        uVar20 = uVar15;
        if (ringbuffer[uVar15 + uVar13] != *puVar12) break;
        puVar12 = puVar12 + 1;
        uVar15 = uVar15 + 1;
        uVar17 = uVar17 - 1;
        uVar20 = uVar23;
      } while (uVar17 != 0);
    }
LAB_00117361:
    if ((uVar20 < 4) || (uVar13 = uVar20 * 0x87 + 0x78f, uVar13 < 0x7e5)) {
      local_e0 = 0;
      uVar20 = 0;
    }
    else {
      uVar24 = puVar3[uVar20];
      local_c0 = uVar13;
    }
  }
  else {
    local_e0 = 0;
    uVar20 = 0;
  }
  puVar25 = (uint *)(hasher + ((ulong)(*(long *)(ringbuffer + uVar34) * 0x35a7bd1e35a7bd00) >> 0x2c)
                              * 4 + 0x28);
  uVar13 = (ulong)((uint)local_e8 & 7);
  iVar19 = 0;
  do {
    uVar27 = *puVar25;
    uVar32 = local_68 & uVar27;
    if (((uVar24 == ringbuffer[uVar20 + uVar32]) && (sVar22 != uVar27)) &&
       (uVar15 = sVar22 - uVar27, uVar15 <= uVar18)) {
      if (7 < local_e8) {
        lVar16 = 0;
        uVar17 = 0;
LAB_00116e05:
        if (*(ulong *)(puVar3 + uVar17 * 8) == *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)uVar32))
        goto code_r0x00116e13;
        uVar23 = *(ulong *)(ringbuffer + uVar17 * 8 + (ulong)uVar32) ^
                 *(ulong *)(puVar3 + uVar17 * 8);
        uVar17 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        uVar17 = (uVar17 >> 3 & 0x1fffffff) - lVar16;
        goto LAB_00116e4d;
      }
      uVar23 = 0;
      puVar12 = puVar3;
LAB_00116ea0:
      uVar17 = uVar23;
      if (uVar13 != 0) {
        uVar30 = uVar13 | uVar23;
        uVar31 = uVar13;
        do {
          uVar17 = uVar23;
          if (ringbuffer[uVar23 + uVar32] != *puVar12) break;
          puVar12 = puVar12 + 1;
          uVar23 = uVar23 + 1;
          uVar31 = uVar31 - 1;
          uVar17 = uVar30;
        } while (uVar31 != 0);
      }
LAB_00116e4d:
      if (3 < uVar17) {
        iVar6 = 0x1f;
        if ((uint)uVar15 != 0) {
          for (; (uint)uVar15 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        uVar23 = (ulong)(iVar6 * -0x1e + 0x780) + uVar17 * 0x87;
        if (local_c0 < uVar23) {
          uVar24 = puVar3[uVar17];
          uVar20 = uVar17;
          local_e0 = uVar15;
          local_c0 = uVar23;
        }
      }
    }
    puVar25 = puVar25 + 1;
    iVar19 = iVar19 + 1;
  } while (iVar19 != 4);
  *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + uVar34) * 0x35a7bd1e35a7bd00) >>
                                  0x2c) + ((uint)(sVar22 >> 3) & 3)) * 4 + 0x28) = (int)sVar22;
  if (0x7e4 < local_c0) {
    iVar19 = *dist_cache;
    uVar18 = (lVar4 + num_bytes) - sVar22;
    iVar6 = 0;
LAB_00116f27:
    local_e8 = local_e8 - 1;
    uVar34 = uVar20 - 1;
    if (local_e8 <= uVar20 - 1) {
      uVar34 = local_e8;
    }
    if (4 < params->quality) {
      uVar34 = 0;
    }
    uVar13 = sVar22 + 1;
    uVar35 = uVar33;
    if (uVar13 < uVar33) {
      uVar35 = uVar13;
    }
    puVar3 = ringbuffer + (uVar13 & ringbuffer_mask);
    uVar24 = puVar3[uVar34];
    uVar15 = uVar13 - (long)iVar19;
    local_c8 = 0x7e4;
    if ((uVar15 < uVar13) &&
       (uVar27 = (uint)uVar15 & local_68, uVar24 == ringbuffer[uVar34 + uVar27])) {
      if (7 < local_e8) {
        lVar16 = 0;
        uVar15 = 0;
LAB_00116fc1:
        if (*(ulong *)(puVar3 + uVar15 * 8) == *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar27))
        goto code_r0x00116fce;
        uVar17 = *(ulong *)(ringbuffer + uVar15 * 8 + (ulong)uVar27) ^
                 *(ulong *)(puVar3 + uVar15 * 8);
        uVar15 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar15 = (uVar15 >> 3 & 0x1fffffff) - lVar16;
        goto LAB_00116ffa;
      }
      uVar15 = 0;
      puVar12 = puVar3;
      goto LAB_0011721e;
    }
    goto LAB_00117038;
  }
  local_f8 = local_f8 + 1;
  position = sVar22 + 1;
  if (uVar35 < position) {
    if ((uint)((int)lVar28 * 4) + uVar35 < position) {
      uVar18 = sVar22 + 0x11;
      if (uVar1 <= sVar22 + 0x11) {
        uVar18 = uVar1;
      }
      for (; position < uVar18; position = position + 4) {
        *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                                 ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
        local_f8 = local_f8 + 4;
      }
    }
    else {
      uVar18 = sVar22 + 9;
      if (uVar1 <= sVar22 + 9) {
        uVar18 = uVar1;
      }
      for (; position < uVar18; position = position + 2) {
        *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)
                                                          ) * 0x35a7bd1e35a7bd00) >> 0x2c) +
                                 ((uint)(position >> 3) & 3)) * 4 + 0x28) = (int)position;
        local_f8 = local_f8 + 2;
      }
    }
  }
  goto LAB_001176f7;
code_r0x00116d3a:
  uVar20 = uVar20 + 1;
  lVar16 = lVar16 + -8;
  if (local_e8 >> 3 == uVar20) goto LAB_00117746;
  goto LAB_00116d29;
code_r0x00116e13:
  uVar17 = uVar17 + 1;
  lVar16 = lVar16 + -8;
  uVar23 = local_e8 & 0xfffffffffffffff8;
  puVar12 = ringbuffer + (local_e8 & 0xfffffffffffffff8) + uVar34;
  if (local_e8 >> 3 == uVar17) goto LAB_00116ea0;
  goto LAB_00116e05;
code_r0x00116fce:
  uVar15 = uVar15 + 1;
  lVar16 = lVar16 + -8;
  if (uVar18 >> 3 == uVar15) goto code_r0x00116fdc;
  goto LAB_00116fc1;
code_r0x00116fdc:
  uVar15 = -lVar16;
  puVar12 = puVar3 + -lVar16;
LAB_0011721e:
  uVar17 = local_e8 & 7;
  for (; (uVar17 != 0 && (ringbuffer[uVar15 + uVar27] == *puVar12)); uVar15 = uVar15 + 1) {
    puVar12 = puVar12 + 1;
    uVar17 = uVar17 - 1;
  }
LAB_00116ffa:
  if (uVar15 < 4) {
    local_d0 = 0;
  }
  else {
    uVar17 = uVar15 * 0x87 + 0x78f;
    if (uVar17 < 0x7e5) {
LAB_00117038:
      local_d0 = 0;
    }
    else {
      uVar24 = puVar3[uVar15];
      uVar34 = uVar15;
      local_d0 = (long)iVar19;
      local_c8 = uVar17;
    }
  }
  puVar25 = (uint *)(hasher + ((ulong)(*(long *)(ringbuffer + (uVar13 & ringbuffer_mask)) *
                                      0x35a7bd1e35a7bd00) >> 0x2c) * 4 + 0x28);
  uVar15 = (ulong)((uint)local_e8 & 7);
  iVar29 = 0;
LAB_00117079:
  uVar27 = *puVar25;
  uVar32 = local_68 & uVar27;
  if (((uVar24 == ringbuffer[uVar34 + uVar32]) && (uVar13 != uVar27)) &&
     (uVar17 = uVar13 - uVar27, uVar17 <= uVar35)) {
    uVar23 = uVar15;
    if (7 < local_e8) {
      lVar16 = 0;
      uVar31 = 0;
LAB_001170ba:
      if (*(ulong *)(puVar3 + uVar31 * 8) == *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)uVar32))
      goto code_r0x001170c7;
      uVar31 = *(ulong *)(ringbuffer + uVar31 * 8 + (ulong)uVar32) ^ *(ulong *)(puVar3 + uVar31 * 8)
      ;
      uVar23 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
        }
      }
      uVar31 = (uVar23 >> 3 & 0x1fffffff) - lVar16;
      goto LAB_001170f1;
    }
    uVar31 = 0;
    puVar12 = puVar3;
    goto joined_r0x00117150;
  }
  goto LAB_00117131;
code_r0x001170c7:
  uVar31 = uVar31 + 1;
  lVar16 = lVar16 + -8;
  if (uVar18 >> 3 == uVar31) goto code_r0x001170d5;
  goto LAB_001170ba;
code_r0x001170d5:
  uVar31 = -lVar16;
  puVar12 = puVar3 + -lVar16;
joined_r0x00117150:
  for (; (uVar23 != 0 && (ringbuffer[uVar31 + uVar32] == *puVar12)); uVar31 = uVar31 + 1) {
    puVar12 = puVar12 + 1;
    uVar23 = uVar23 - 1;
  }
LAB_001170f1:
  if (3 < uVar31) {
    iVar7 = 0x1f;
    if ((uint)uVar17 != 0) {
      for (; (uint)uVar17 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    uVar23 = (ulong)(iVar7 * -0x1e + 0x780) + uVar31 * 0x87;
    if (local_c8 < uVar23) {
      uVar24 = puVar3[uVar31];
      uVar34 = uVar31;
      local_d0 = uVar17;
      local_c8 = uVar23;
    }
  }
LAB_00117131:
  puVar25 = puVar25 + 1;
  iVar29 = iVar29 + 1;
  if (iVar29 == 4) goto LAB_0011716b;
  goto LAB_00117079;
LAB_0011716b:
  *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar13 & ringbuffer_mask)) *
                                          0x35a7bd1e35a7bd00) >> 0x2c) + ((uint)(uVar13 >> 3) & 3))
                    * 4 + 0x28) = (int)uVar13;
  bVar36 = local_c0 + 0xaf <= local_c8;
  uVar35 = sVar22;
  iVar29 = iVar6;
  if (bVar36) {
    local_f8 = local_f8 + 1;
    local_c0 = local_c8;
    local_e0 = local_d0;
    uVar35 = uVar13;
    uVar20 = uVar34;
    iVar29 = iVar6 + 1;
  }
  bVar5 = 2 < iVar6;
  uVar34 = sVar22 + 9;
  uVar18 = uVar18 - 1;
  sVar22 = uVar35;
  iVar6 = iVar29;
  if (!bVar36 || (bVar5 || uVar2 <= uVar34)) goto LAB_001172e3;
  goto LAB_00116f27;
LAB_001172e3:
  uVar18 = uVar33;
  if (uVar35 < uVar33) {
    uVar18 = uVar35;
  }
  if (local_e0 <= uVar18) {
    uVar27 = 0;
    bVar36 = false;
    if (local_e0 != (long)*dist_cache) {
      if (local_e0 == (long)dist_cache[1]) {
        uVar27 = 1;
LAB_00117328:
        bVar36 = false;
      }
      else {
        uVar34 = (local_e0 + 3) - (long)*dist_cache;
        if (uVar34 < 7) {
          iVar19 = (int)uVar34;
          uVar27 = 0x9750468;
        }
        else {
          uVar34 = (local_e0 + 3) - (long)dist_cache[1];
          if (6 < uVar34) {
            if (local_e0 != (long)dist_cache[2]) {
              bVar36 = local_e0 != (long)dist_cache[3];
              uVar27 = 3;
              goto LAB_00117443;
            }
            uVar27 = 2;
            goto LAB_00117328;
          }
          iVar19 = (int)uVar34;
          uVar27 = 0xfdb1ace;
        }
        uVar27 = uVar27 >> ((byte)(iVar19 << 2) & 0x1f) & 0xf;
        bVar36 = false;
      }
    }
LAB_00117443:
    if (!bVar36) {
      uVar34 = (ulong)uVar27;
      goto LAB_0011744f;
    }
  }
  uVar34 = local_e0 + 0xf;
LAB_0011744f:
  if ((local_e0 <= uVar18) && (uVar34 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_e0;
  }
  pCVar26->insert_len_ = (uint32_t)local_f8;
  uVar21 = (uint32_t)uVar20;
  pCVar26->copy_len_ = uVar21;
  uVar13 = (ulong)(params->dist).num_direct_distance_codes;
  uVar18 = uVar13 + 0x10;
  if (uVar34 < uVar18) {
    pCVar26->dist_prefix_ = (uint16_t)uVar34;
    uVar10 = 0;
  }
  else {
    uVar10 = (params->dist).distance_postfix_bits;
    bVar14 = (byte)uVar10;
    uVar34 = ((uVar34 - uVar13) + (4L << (bVar14 & 0x3f))) - 0x10;
    uVar27 = 0x1f;
    if ((uint)uVar34 != 0) {
      for (; (uint)uVar34 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    uVar27 = (uVar27 ^ 0xffffffe0) + 0x1f;
    bVar36 = (uVar34 >> ((ulong)uVar27 & 0x3f) & 1) != 0;
    iVar19 = uVar27 - uVar10;
    pCVar26->dist_prefix_ =
         (short)((uint)bVar36 + iVar19 * 2 + 0xfffe << (bVar14 & 0x3f)) +
         (short)uVar18 + (~(ushort)(-1 << (bVar14 & 0x1f)) & (ushort)uVar34) | (short)iVar19 * 0x400
    ;
    uVar10 = (uint32_t)(uVar34 - ((ulong)bVar36 + 2 << ((byte)uVar27 & 0x3f)) >> (bVar14 & 0x3f));
  }
  pCVar26->dist_extra_ = uVar10;
  sVar22 = local_f8;
  if (5 < local_f8) {
    if (local_f8 < 0x82) {
      uVar27 = 0x1f;
      uVar32 = (uint)(local_f8 - 2);
      if (uVar32 != 0) {
        for (; uVar32 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      sVar22 = (size_t)((int)(local_f8 - 2 >> ((char)(uVar27 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                        (uVar27 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (local_f8 < 0x842) {
      uVar32 = (uint32_t)local_f8 - 0x42;
      uVar27 = 0x1f;
      if (uVar32 != 0) {
        for (; uVar32 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      sVar22 = (size_t)((uVar27 ^ 0xffe0) + 0x2a);
    }
    else {
      sVar22 = 0x15;
      if (0x1841 < local_f8) {
        sVar22 = (size_t)(ushort)(0x17 - (local_f8 < 0x5842));
      }
    }
  }
  uVar18 = (ulong)(int)uVar21;
  if (uVar18 < 10) {
    uVar27 = uVar21 - 2;
  }
  else if (uVar18 < 0x86) {
    uVar27 = 0x1f;
    uVar32 = (uint)(uVar18 - 6);
    if (uVar32 != 0) {
      for (; uVar32 >> uVar27 == 0; uVar27 = uVar27 - 1) {
      }
    }
    uVar27 = (int)(uVar18 - 6 >> ((char)(uVar27 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
             (uVar27 ^ 0xffffffe0) * 2 + 0x42;
  }
  else {
    uVar27 = 0x17;
    if (uVar18 < 0x846) {
      uVar27 = 0x1f;
      if (uVar21 - 0x46 != 0) {
        for (; uVar21 - 0x46 >> uVar27 == 0; uVar27 = uVar27 - 1) {
        }
      }
      uVar27 = (uVar27 ^ 0xffe0) + 0x2c;
    }
  }
  uVar8 = (ushort)uVar27;
  uVar9 = (uVar8 & 7) + ((ushort)sVar22 & 7) * 8;
  if ((((pCVar26->dist_prefix_ & 0x3ff) == 0) && ((ushort)sVar22 < 8)) && (uVar8 < 0x10)) {
    if (7 < uVar8) {
      uVar9 = uVar9 | 0x40;
    }
  }
  else {
    iVar19 = (int)((sVar22 & 0xffff) >> 3) * 3 + ((uVar27 & 0xffff) >> 3);
    uVar9 = uVar9 + ((ushort)(0x520d40 >> ((char)iVar19 * '\x02' & 0x1fU)) & 0xc0) +
                    (short)iVar19 * 0x40 + 0x40;
  }
  pCVar26->cmd_prefix_ = uVar9;
  *num_literals = *num_literals + local_f8;
  position = uVar35 + uVar20;
  uVar18 = uVar11;
  if (position < uVar11) {
    uVar18 = position;
  }
  uVar34 = uVar35 + 2;
  if (local_e0 < uVar20 >> 2) {
    uVar13 = position + local_e0 * -4;
    if (uVar13 < uVar34) {
      uVar13 = uVar34;
    }
    uVar34 = uVar13;
    if (uVar18 < uVar13) {
      uVar34 = uVar18;
    }
  }
  uVar35 = lVar28 + uVar20 * 2 + uVar35;
  pCVar26 = pCVar26 + 1;
  if (uVar34 < uVar18) {
    do {
      *(int *)(hasher + (ulong)((uint)((ulong)(*(long *)(ringbuffer + (uVar34 & ringbuffer_mask)) *
                                              0x35a7bd1e35a7bd00) >> 0x2c) +
                               ((uint)(uVar34 >> 3) & 3)) * 4 + 0x28) = (int)uVar34;
      uVar34 = uVar34 + 1;
    } while (uVar18 != uVar34);
    local_f8 = 0;
  }
  else {
    local_f8 = 0;
  }
LAB_001176f7:
  sVar22 = position;
  if (uVar2 <= position + 8) goto LAB_0011777e;
  goto LAB_00116c9d;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}